

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrbtree_test.c
# Opt level: O1

void test_speed(int nvalues)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  xrbt_t *tr;
  xrbt_iter_t pxVar4;
  clock_t cVar5;
  clock_t cVar6;
  uint uVar7;
  uint uVar8;
  int value;
  uint local_3c;
  ulong local_38;
  
  uVar8 = 0;
  tr = xrbt_new(4,on_cmp2,(xrbt_destroy_cb)0x0);
  srand(0x1e240);
  local_38 = clock();
  if (0 < nvalues) {
    uVar7 = 0;
    do {
      iVar1 = rand();
      uVar2 = rand();
      local_3c = uVar2 & 0xffff | iVar1 << 0x10;
      pxVar4 = xrbt_insert_ex(tr,&local_3c,tr->data_size);
      if (pxVar4 == (xrbt_iter_t)0x0) {
        printf("out of memory when insert %d value.\n",(ulong)uVar7);
        break;
      }
      uVar7 = uVar7 + 1;
    } while (nvalues != uVar7);
  }
  cVar5 = clock();
  printf("insert %d random integer done, values %u, time %lfs.\n",
         (double)(long)(cVar5 - local_38) / 1000000.0,nvalues,(ulong)(uint)tr->size);
  tree_overview(tr);
  srand(0x1e240);
  cVar5 = clock();
  local_38 = CONCAT44(local_38._4_4_,nvalues);
  if (0 < nvalues) {
    uVar8 = 0;
    do {
      iVar1 = rand();
      uVar7 = rand();
      local_3c = uVar7 & 0xffff | iVar1 << 0x10;
      pxVar4 = xrbt_find(tr,&local_3c);
      uVar8 = (uVar8 + 1) - (uint)(pxVar4 == (xrbt_iter_t)0x0);
      nvalues = nvalues + -1;
    } while (nvalues != 0);
  }
  cVar6 = clock();
  iVar1 = (int)local_38;
  printf("search %d random integer done, time %lfs, %d found.\n",(double)(cVar6 - cVar5) / 1000000.0
         ,local_38 & 0xffffffff,(ulong)uVar8);
  srand(0x1e240);
  cVar5 = clock();
  uVar8 = 0;
  if (0 < iVar1) {
    do {
      iVar3 = rand();
      uVar7 = rand();
      local_3c = uVar7 & 0xffff | iVar3 << 0x10;
      pxVar4 = xrbt_find(tr,&local_3c);
      if (pxVar4 == (xrbt_iter_t)0x0) {
        uVar8 = uVar8 + 1;
      }
      else {
        xrbt_erase(tr,pxVar4);
      }
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  cVar6 = clock();
  printf("remove %d random integer done, time %lfs, %d not found.\n",
         (double)(cVar6 - cVar5) / 1000000.0,local_38 & 0xffffffff,(ulong)uVar8);
  puts("press any key to continue...");
  getchar();
  xrbt_free(tr);
  return;
}

Assistant:

void test_speed(int nvalues)
{
    xrbt_t* rb = xrbt_new(sizeof(int), on_cmp2, NULL);
    clock_t begin, end;
    int value, count, i;

    srand(RAND_SEED);
    // generate 'nvalues' random integer and insert into 'rb'
    begin = clock();
    for (i = 0; i < nvalues; ++i)
    {
        value = rand_int();
        if (!xrbt_insert(rb, &value))
        {
            printf("out of memory when insert %d value.\n", i);
            break;
        }
    }
    end = clock();
    printf("insert %d random integer done, values %u, time %lfs.\n",
            nvalues, (unsigned)xrbt_size(rb), (double)(end - begin) / CLOCKS_PER_SEC);

    tree_overview(rb);

    // reset the same seed to get the same series number
    srand(RAND_SEED);
    // search time test
    begin = clock();
    for (count = 0, i = 0; i < nvalues; ++i)
    {
        value = rand_int();
        if (xrbt_find(rb, &value))
            ++count;
    }
    end = clock();
    printf("search %d random integer done, time %lfs, %d found.\n",
            nvalues, (double)(end - begin) / CLOCKS_PER_SEC, count);

    // reset the same seed to get the same series number
    srand(RAND_SEED);
    // remove time test
    begin = clock();
    for (count = 0, i = 0; i < nvalues; ++i)
    {
        value = rand_int();
        xrbt_iter_t iter = xrbt_find(rb, &value);
        if (iter)
            xrbt_erase(rb, iter);
        else
            ++count;
    }
    end = clock();
    printf("remove %d random integer done, time %lfs, %d not found.\n",
            nvalues, (double)(end - begin) / CLOCKS_PER_SEC, count);

    printf("press any key to continue...\n");
    getchar();
    xrbt_free(rb);
}